

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup3.c
# Opt level: O0

void hashword2(uint32_t *k,size_t length,uint32_t *pc,uint32_t *pb)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint32_t c;
  uint32_t b;
  uint32_t a;
  uint32_t *pb_local;
  uint32_t *pc_local;
  size_t length_local;
  uint32_t *k_local;
  
  c = (int)length * 4 + -0x21524111 + *pc;
  b = c;
  a = c;
  k_local = k;
  for (length_local = length; 3 < length_local; length_local = length_local - 3) {
    uVar1 = k_local[2] + c;
    uVar2 = uVar1 * 0x10 ^ uVar1 >> 0x1c ^ (*k_local + a) - uVar1;
    iVar3 = k_local[1] + b + uVar1;
    uVar1 = uVar2 << 6 ^ uVar2 >> 0x1a ^ (k_local[1] + b) - uVar2;
    iVar4 = iVar3 + uVar2;
    uVar2 = uVar1 << 8 ^ uVar1 >> 0x18 ^ iVar3 - uVar1;
    iVar3 = iVar4 + uVar1;
    uVar1 = uVar2 << 0x10 ^ uVar2 >> 0x10 ^ iVar4 - uVar2;
    iVar4 = iVar3 + uVar2;
    uVar2 = uVar1 << 0x13 ^ uVar1 >> 0xd ^ iVar3 - uVar1;
    a = iVar4 + uVar1;
    c = uVar2 << 4 ^ uVar2 >> 0x1c ^ iVar4 - uVar2;
    b = a + uVar2;
    k_local = k_local + 3;
  }
  switch(length_local) {
  case 3:
    c = k_local[2] + c;
  case 2:
    b = k_local[1] + b;
  case 1:
    uVar1 = (b ^ c) - (b << 0xe ^ b >> 0x12);
    uVar2 = (uVar1 ^ *k_local + a) - (uVar1 * 0x800 ^ uVar1 >> 0x15);
    uVar5 = (uVar2 ^ b) - (uVar2 * 0x2000000 ^ uVar2 >> 7);
    uVar1 = (uVar5 ^ uVar1) - (uVar5 * 0x10000 ^ uVar5 >> 0x10);
    uVar2 = (uVar1 ^ uVar2) - (uVar1 * 0x10 ^ uVar1 >> 0x1c);
    b = (uVar2 ^ uVar5) - (uVar2 * 0x4000 ^ uVar2 >> 0x12);
    c = (b ^ uVar1) - (b * 0x1000000 ^ b >> 8);
  case 0:
  default:
    *pc = c;
    *pb = b;
    return;
  }
}

Assistant:

void hashword2(
const uint32_t *k,                   /* the key, an array of uint32_t values */
size_t          length,               /* the length of the key, in uint32_ts */
uint32_t        *pc,
uint32_t        *pb)         /* the previous hash, or an arbitrary value */
{
  uint32_t a,b,c;

  /* Set up the internal state */
  a = b = c = 0xdeadbeef + (((uint32_t)length)<<2) + *pc;

  /*------------------------------------------------- handle most of the key */
  while (length > 3)
  {
    a += k[0];
    b += k[1];
    c += k[2];
    mix(a,b,c);
    length -= 3;
    k += 3;
  }

  /*------------------------------------------- handle the last 3 uint32_t's */
  switch(length)                     /* all the case statements fall through */
  { 
  case 3 : c+=k[2];
  case 2 : b+=k[1];
  case 1 : a+=k[0];
    final(a,b,c);
  case 0:     /* case 0: nothing left to add */
    break;
  }
  /*------------------------------------------------------ report the result */
  *pc = c;
  *pb = b;
}